

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall ParseDouble_Rounding_Test::TestBody(ParseDouble_Rounding_Test *this)

{
  anon_unknown.dwarf_90916::AssertHexDoubleEquals(0x7feffffffffffffd,"0x1.ffffffffffffd0p1023");
  anon_unknown.dwarf_90916::AssertHexDoubleEquals(0x7feffffffffffffe,"0x1.ffffffffffffd8p1023");
  anon_unknown.dwarf_90916::AssertHexDoubleEquals(0x7feffffffffffffe,"0x1.ffffffffffffe0p1023");
  anon_unknown.dwarf_90916::AssertHexDoubleEquals(0x7feffffffffffffe,"0x1.ffffffffffffe8p1023");
  anon_unknown.dwarf_90916::AssertHexDoubleEquals(0x7fefffffffffffff,"0x1.fffffffffffff0p1023");
  return;
}

Assistant:

TEST(ParseDouble, Rounding) {
  // |-------------------- 52 bits ---------------------| V-- extra bit
  //
  // 1111111111111111111111111111111111111111111111111101 0  ==> no rounding
  AssertHexDoubleEquals(0x7feffffffffffffd, "0x1.ffffffffffffd0p1023");
  // 1111111111111111111111111111111111111111111111111101 1  ==> round up
  AssertHexDoubleEquals(0x7feffffffffffffe, "0x1.ffffffffffffd8p1023");
  // 1111111111111111111111111111111111111111111111111110 0  ==> no rounding
  AssertHexDoubleEquals(0x7feffffffffffffe, "0x1.ffffffffffffe0p1023");
  // 1111111111111111111111111111111111111111111111111110 1  ==> round down
  AssertHexDoubleEquals(0x7feffffffffffffe, "0x1.ffffffffffffe8p1023");
  // 1111111111111111111111111111111111111111111111111111 0  ==> no rounding
  AssertHexDoubleEquals(0x7fefffffffffffff, "0x1.fffffffffffff0p1023");
}